

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

ssize_t Curl_cf_recv(Curl_easy *data,int num,char *buf,size_t len,CURLcode *code)

{
  Curl_cfilter *pCVar1;
  ssize_t sVar2;
  Curl_cfilter **ppCVar3;
  
  *code = CURLE_OK;
  ppCVar3 = data->conn->cfilter + num;
  while( true ) {
    pCVar1 = *ppCVar3;
    if (pCVar1 == (Curl_cfilter *)0x0) {
      Curl_failf(data,"recv: no filter connected");
      *code = CURLE_FAILED_INIT;
      return -1;
    }
    if ((pCVar1->field_0x24 & 1) != 0) break;
    ppCVar3 = &pCVar1->next;
  }
  sVar2 = (*pCVar1->cft->do_recv)(pCVar1,data,buf,len,code);
  return sVar2;
}

Assistant:

ssize_t Curl_cf_recv(struct Curl_easy *data, int num, char *buf,
                     size_t len, CURLcode *code)
{
  struct Curl_cfilter *cf;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  *code = CURLE_OK;
  cf = data->conn->cfilter[num];
  while(cf && !cf->connected) {
    cf = cf->next;
  }
  if(cf) {
    ssize_t nread = cf->cft->do_recv(cf, data, buf, len, code);
    DEBUGASSERT(nread >= 0 || *code);
    DEBUGASSERT(nread < 0 || !*code);
    return nread;
  }
  failf(data, "recv: no filter connected");
  *code = CURLE_FAILED_INIT;
  return -1;
}